

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> *field)

{
  ImportModuleField *pIVar1;
  FuncImport *pFVar2;
  ExceptionImport *pEVar3;
  MemoryImport *pMVar4;
  GlobalImport *pGVar5;
  TableImport *pTVar6;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  *p_Var7;
  int iVar8;
  Func *pFVar9;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_70;
  Func *local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  undefined4 uStack_4c;
  int local_48;
  _Head_base<0UL,_wabt::Import_*,_false> local_38;
  Import *import;
  
  local_38._M_head_impl =
       *(Import **)
        &(((field->_M_t).
           super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->import)._M_t.
         super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>;
  switch((local_38._M_head_impl)->kind_) {
  case First:
    pFVar2 = cast<wabt::FuncImport,wabt::Import>(local_38._M_head_impl);
    pFVar9 = &pFVar2->func;
    p_Var7 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->func_bindings;
    iVar8 = (int)((ulong)((long)(this->funcs).
                                super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->funcs).
                               super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    local_68 = pFVar9;
    std::vector<wabt::Func*,std::allocator<wabt::Func*>>::emplace_back<wabt::Func*>
              ((vector<wabt::Func*,std::allocator<wabt::Func*>> *)&this->funcs,&local_68);
    this->num_func_imports = this->num_func_imports + 1;
    break;
  case Table:
    pTVar6 = cast<wabt::TableImport,wabt::Import>(local_38._M_head_impl);
    pFVar9 = (Func *)&pTVar6->table;
    p_Var7 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->table_bindings;
    iVar8 = (int)((ulong)((long)(this->tables).
                                super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->tables).
                               super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    local_68 = pFVar9;
    std::vector<wabt::Table*,std::allocator<wabt::Table*>>::emplace_back<wabt::Table*>
              ((vector<wabt::Table*,std::allocator<wabt::Table*>> *)&this->tables,
               (Table **)&local_68);
    this->num_table_imports = this->num_table_imports + 1;
    break;
  case Memory:
    pMVar4 = cast<wabt::MemoryImport,wabt::Import>(local_38._M_head_impl);
    pFVar9 = (Func *)&pMVar4->memory;
    p_Var7 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->memory_bindings;
    iVar8 = (int)((ulong)((long)(this->memories).
                                super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->memories).
                               super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    local_68 = pFVar9;
    std::vector<wabt::Memory*,std::allocator<wabt::Memory*>>::emplace_back<wabt::Memory*>
              ((vector<wabt::Memory*,std::allocator<wabt::Memory*>> *)&this->memories,
               (Memory **)&local_68);
    this->num_memory_imports = this->num_memory_imports + 1;
    break;
  case Global:
    pGVar5 = cast<wabt::GlobalImport,wabt::Import>(local_38._M_head_impl);
    pFVar9 = (Func *)&pGVar5->global;
    p_Var7 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->global_bindings;
    iVar8 = (int)((ulong)((long)(this->globals).
                                super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->globals).
                               super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    local_68 = pFVar9;
    std::vector<wabt::Global*,std::allocator<wabt::Global*>>::emplace_back<wabt::Global*>
              ((vector<wabt::Global*,std::allocator<wabt::Global*>> *)&this->globals,
               (Global **)&local_68);
    this->num_global_imports = this->num_global_imports + 1;
    break;
  case Except:
    pEVar3 = cast<wabt::ExceptionImport,wabt::Import>(local_38._M_head_impl);
    pFVar9 = (Func *)&pEVar3->except;
    p_Var7 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->except_bindings;
    iVar8 = (int)((ulong)((long)(this->excepts).
                                super__Vector_base<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->excepts).
                               super__Vector_base<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
    local_68 = pFVar9;
    std::vector<wabt::Exception*,std::allocator<wabt::Exception*>>::emplace_back<wabt::Exception*>
              ((vector<wabt::Exception*,std::allocator<wabt::Exception*>> *)&this->excepts,
               (Exception **)&local_68);
    this->num_except_imports = this->num_except_imports + 1;
    break;
  default:
    iVar8 = -1;
    p_Var7 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)0x0;
    pFVar9 = (Func *)0x0;
  }
  if (((iVar8 != -1) && (pFVar9 != (Func *)0x0)) &&
     (p_Var7 != (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                 *)0x0)) {
    if ((pFVar9->name)._M_string_length != 0) {
      pIVar1 = (field->_M_t).
               super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
               .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl;
      local_68 = (Func *)(pIVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                         super_ModuleField.loc.filename.data_;
      uStack_60 = (undefined4)
                  (pIVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.
                  filename.size_;
      uStack_5c = *(undefined4 *)
                   ((long)&(pIVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                           super_ModuleField.loc.filename.size_ + 4);
      local_58 = (pIVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.
                 field_1.field_0.line;
      iStack_54 = (pIVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.
                  field_1.field_0.first_column;
      iStack_50 = (pIVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.
                  field_1.field_0.last_column;
      uStack_4c = *(undefined4 *)
                   ((long)&(pIVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                           super_ModuleField.loc.field_1 + 0xc);
      local_48 = iVar8;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string_const&,wabt::Binding>(p_Var7,pFVar9);
    }
    std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>::push_back
              (&this->imports,&local_38._M_head_impl);
    local_70._M_head_impl =
         (field->_M_t).
         super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
         ._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl;
    (field->_M_t).
    super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>.
    _M_t.
    super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
    .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl = (ImportModuleField *)0x0
    ;
    intrusive_list<wabt::ModuleField>::push_back
              (&this->fields,
               (unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)&local_70);
    if (local_70._M_head_impl != (ImportModuleField *)0x0) {
      (*((local_70._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField._vptr_ModuleField[1])();
    }
    return;
  }
  __assert_fail("name && bindings && index != kInvalidIndex",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.cc"
                ,0x1c3,"void wabt::Module::AppendField(std::unique_ptr<ImportModuleField>)");
}

Assistant:

void Module::AppendField(std::unique_ptr<ImportModuleField> field) {
  Import* import = field->import.get();
  const std::string* name = nullptr;
  BindingHash* bindings = nullptr;
  Index index = kInvalidIndex;

  switch (import->kind()) {
    case ExternalKind::Func: {
      Func& func = cast<FuncImport>(import)->func;
      name = &func.name;
      bindings = &func_bindings;
      index = funcs.size();
      funcs.push_back(&func);
      ++num_func_imports;
      break;
    }

    case ExternalKind::Table: {
      Table& table = cast<TableImport>(import)->table;
      name = &table.name;
      bindings = &table_bindings;
      index = tables.size();
      tables.push_back(&table);
      ++num_table_imports;
      break;
    }

    case ExternalKind::Memory: {
      Memory& memory = cast<MemoryImport>(import)->memory;
      name = &memory.name;
      bindings = &memory_bindings;
      index = memories.size();
      memories.push_back(&memory);
      ++num_memory_imports;
      break;
    }

    case ExternalKind::Global: {
      Global& global = cast<GlobalImport>(import)->global;
      name = &global.name;
      bindings = &global_bindings;
      index = globals.size();
      globals.push_back(&global);
      ++num_global_imports;
      break;
    }

    case ExternalKind::Except: {
      Exception& except = cast<ExceptionImport>(import)->except;
      name = &except.name;
      bindings = &except_bindings;
      index = excepts.size();
      excepts.push_back(&except);
      ++num_except_imports;
      break;
    }
  }

  assert(name && bindings && index != kInvalidIndex);
  if (!name->empty()) {
    bindings->emplace(*name, Binding(field->loc, index));
  }
  imports.push_back(import);
  fields.push_back(std::move(field));
}